

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderErrorCode
WriteRingBuffer(BrotliDecoderStateInternal *s,size_t *available_out,uint8_t **next_out,
               size_t *total_out,int force)

{
  int iVar1;
  uint8_t *puVar2;
  ulong uVar3;
  size_t sVar4;
  size_t local_50;
  size_t num_written;
  size_t to_write;
  uint8_t *start;
  int force_local;
  size_t *total_out_local;
  uint8_t **next_out_local;
  size_t *available_out_local;
  BrotliDecoderStateInternal *s_local;
  
  puVar2 = s->ringbuffer;
  uVar3 = s->partial_pos_out;
  iVar1 = s->ringbuffer_mask;
  sVar4 = UnwrittenBytes(s,1);
  local_50 = *available_out;
  if (sVar4 < *available_out) {
    local_50 = sVar4;
  }
  if (s->meta_block_remaining_len < 0) {
    s_local._4_4_ = BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_1;
  }
  else {
    if ((next_out == (uint8_t **)0x0) || (*next_out != (uint8_t *)0x0)) {
      if (next_out != (uint8_t **)0x0) {
        memcpy(*next_out,puVar2 + (uVar3 & (long)iVar1),local_50);
        *next_out = *next_out + local_50;
      }
    }
    else {
      *next_out = puVar2 + (uVar3 & (long)iVar1);
    }
    *available_out = *available_out - local_50;
    s->partial_pos_out = local_50 + s->partial_pos_out;
    if (total_out != (size_t *)0x0) {
      *total_out = s->partial_pos_out;
    }
    if (local_50 < sVar4) {
      if ((s->ringbuffer_size == 1 << ((byte)s->window_bits & 0x1f)) || (force != 0)) {
        s_local._4_4_ = BROTLI_DECODER_NEEDS_MORE_OUTPUT;
      }
      else {
        s_local._4_4_ = BROTLI_DECODER_SUCCESS;
      }
    }
    else {
      if ((s->ringbuffer_size == 1 << ((byte)s->window_bits & 0x1f)) &&
         (s->ringbuffer_size <= s->pos)) {
        s->pos = s->pos - s->ringbuffer_size;
        s->rb_roundtrips = s->rb_roundtrips + 1;
        *(ushort *)&s->field_0x338 =
             *(ushort *)&s->field_0x338 & 0xfff7 | (ushort)(s->pos != 0) << 3;
      }
      s_local._4_4_ = BROTLI_DECODER_SUCCESS;
    }
  }
  return s_local._4_4_;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE WriteRingBuffer(
    BrotliDecoderState* s, size_t* available_out, uint8_t** next_out,
    size_t* total_out, BROTLI_BOOL force) {
  uint8_t* start =
      s->ringbuffer + (s->partial_pos_out & (size_t)s->ringbuffer_mask);
  size_t to_write = UnwrittenBytes(s, BROTLI_TRUE);
  size_t num_written = *available_out;
  if (num_written > to_write) {
    num_written = to_write;
  }
  if (s->meta_block_remaining_len < 0) {
    return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_1);
  }
  if (next_out && !*next_out) {
    *next_out = start;
  } else {
    if (next_out) {
      memcpy(*next_out, start, num_written);
      *next_out += num_written;
    }
  }
  *available_out -= num_written;
  BROTLI_LOG_UINT(to_write);
  BROTLI_LOG_UINT(num_written);
  s->partial_pos_out += num_written;
  if (total_out) {
    *total_out = s->partial_pos_out;
  }
  if (num_written < to_write) {
    if (s->ringbuffer_size == (1 << s->window_bits) || force) {
      return BROTLI_DECODER_NEEDS_MORE_OUTPUT;
    } else {
      return BROTLI_DECODER_SUCCESS;
    }
  }
  /* Wrap ring buffer only if it has reached its maximal size. */
  if (s->ringbuffer_size == (1 << s->window_bits) &&
      s->pos >= s->ringbuffer_size) {
    s->pos -= s->ringbuffer_size;
    s->rb_roundtrips++;
    s->should_wrap_ringbuffer = (size_t)s->pos != 0 ? 1 : 0;
  }
  return BROTLI_DECODER_SUCCESS;
}